

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O0

int32 ms_cont_mgau_frame_eval
                (ps_mgau_t *mg,int16 *senscr,uint8 *senone_active,int32 n_senone_active,
                mfcc_t **feat,int32 frame,int32 compallsen)

{
  int32 n_top;
  gauden_t *g_00;
  senone_t *s_00;
  int32 iVar1;
  int local_80;
  int32 bs_1;
  int32 s_3;
  int32 s_2;
  int32 s_1;
  int32 n;
  int32 i;
  int32 bs;
  int32 s;
  senone_t *sen;
  gauden_t *g;
  int32 best;
  int32 topn;
  int32 gid;
  ms_mgau_model_t *msg;
  int32 frame_local;
  mfcc_t **feat_local;
  int32 n_senone_active_local;
  uint8 *senone_active_local;
  int16 *senscr_local;
  ps_mgau_t *mg_local;
  
  n_top = *(int32 *)&mg[2].vt;
  g_00 = (gauden_t *)mg[1].vt;
  s_00 = *(senone_t **)&mg[1].frame_idx;
  if (compallsen == 0) {
    for (best = 0; best < g_00->n_mgau; best = best + 1) {
      *(undefined1 *)((long)&(mg[3].vt)->name + (long)best) = 0;
    }
    s_2 = 0;
    for (s_1 = 0; s_1 < n_senone_active; s_1 = s_1 + 1) {
      s_2 = (uint)senone_active[s_1] + s_2;
      *(undefined1 *)((long)&(mg[3].vt)->name + (ulong)s_00->mgau[s_2]) = 1;
    }
    for (best = 0; best < g_00->n_mgau; best = best + 1) {
      if (*(char *)((long)&(mg[3].vt)->name + (long)best) != '\0') {
        gauden_dist(g_00,best,n_top,feat,
                    *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + (long)best * 8));
      }
    }
    g._4_4_ = 0x7fffffff;
    s_2 = 0;
    for (s_1 = 0; s_1 < n_senone_active; s_1 = s_1 + 1) {
      s_2 = (uint)senone_active[s_1] + s_2;
      iVar1 = senone_eval(s_00,s_2,*(gauden_dist_t ***)
                                    (*(long *)&mg[2].frame_idx + (ulong)s_00->mgau[s_2] * 8),n_top);
      senscr[s_2] = (int16)iVar1;
      if (senscr[s_2] < g._4_4_) {
        g._4_4_ = (int)senscr[s_2];
      }
    }
    s_2 = 0;
    for (s_1 = 0; s_1 < n_senone_active; s_1 = s_1 + 1) {
      s_2 = (uint)senone_active[s_1] + s_2;
      local_80 = senscr[s_2] - g._4_4_;
      if (0x7fff < local_80) {
        local_80 = 0x7fff;
      }
      if (local_80 < -0x8000) {
        local_80 = -0x8000;
      }
      senscr[s_2] = (int16)local_80;
    }
  }
  else {
    for (best = 0; best < g_00->n_mgau; best = best + 1) {
      gauden_dist(g_00,best,n_top,feat,
                  *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + (long)best * 8));
    }
    g._4_4_ = 0x7fffffff;
    for (i = 0; (uint)i < s_00->n_sen; i = i + 1) {
      iVar1 = senone_eval(s_00,i,*(gauden_dist_t ***)
                                  (*(long *)&mg[2].frame_idx + (ulong)s_00->mgau[i] * 8),n_top);
      senscr[i] = (int16)iVar1;
      if (senscr[i] < g._4_4_) {
        g._4_4_ = (int)senscr[i];
      }
    }
    for (i = 0; (uint)i < s_00->n_sen; i = i + 1) {
      n = senscr[i] - g._4_4_;
      if (0x7fff < n) {
        n = 0x7fff;
      }
      if (n < -0x8000) {
        n = -0x8000;
      }
      senscr[i] = (int16)n;
    }
  }
  return 0;
}

Assistant:

int32
ms_cont_mgau_frame_eval(ps_mgau_t * mg,
			int16 *senscr,
			uint8 *senone_active,
			int32 n_senone_active,
                        mfcc_t ** feat,
			int32 frame,
			int32 compallsen)
{
    ms_mgau_model_t *msg = (ms_mgau_model_t *)mg;
    int32 gid;
    int32 topn;
    int32 best;
    gauden_t *g;
    senone_t *sen;

    (void)frame;
    topn = ms_mgau_topn(msg);
    g = ms_mgau_gauden(msg);
    sen = ms_mgau_senone(msg);

    if (compallsen) {
	int32 s;

	for (gid = 0; gid < g->n_mgau; gid++)
	    gauden_dist(g, gid, topn, feat, msg->dist[gid]);

	best = MAX_INT32;
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	}

	/* Normalize senone scores */
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	}
    }
    else {
	int32 i, n;
	/* Flag all active mixture-gaussian codebooks */
	for (gid = 0; gid < g->n_mgau; gid++)
	    msg->mgau_active[gid] = 0;

	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    /* senone_active consists of deltas. */
	    int32 s = senone_active[i] + n;
	    msg->mgau_active[sen->mgau[s]] = 1;
	    n = s;
	}

	/* Compute topn gaussian density values (for active codebooks) */
	for (gid = 0; gid < g->n_mgau; gid++) {
	    if (msg->mgau_active[gid])
		gauden_dist(g, gid, topn, feat, msg->dist[gid]);
	}

	best = MAX_INT32;
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	    n = s;
	}

	/* Normalize senone scores */
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	    n = s;
	}
    }

    return 0;
}